

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O3

void skiwi::compile_vector_fill(asmcode *code,compiler_options *ops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  skiwi *psVar2;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  string repeat;
  string done;
  string error;
  operand local_94 [3];
  string local_88;
  int local_64;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar2 = label;
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_88,psVar2,in_RDX);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_88._M_dataplus._M_p._0_4_ = 5;
    local_60._M_dataplus._M_p._0_4_ = 0x14;
    local_94[0] = NUMBER;
    local_94[1] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_88,(operand *)&local_60,local_94,(int *)(local_94 + 1));
    local_88._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_88,&local_40);
    jump_short_if_arg_is_not_block(code,RCX,R11,&local_40);
  }
  local_60._M_dataplus._M_p._0_4_ = 2;
  local_94[0] = RCX;
  local_94[1] = 0x39;
  local_88._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&local_60,local_94,local_94 + 1,(unsigned_long *)&local_88);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_does_not_point_to_vector(code,RCX,R11,&local_40);
  }
  local_88._M_dataplus._M_p._0_4_ = 0x40;
  local_60._M_dataplus._M_p._0_4_ = 9;
  local_94[0] = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,(operand *)&local_60,local_94);
  local_60._M_dataplus._M_p._0_4_ = 0x40;
  local_94[0] = R11;
  local_94[1] = 0x39;
  local_88._M_dataplus._M_p = (pointer)0xffffffffffffff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,(operation *)&local_60,local_94,local_94 + 1,(long *)&local_88);
  local_88._M_dataplus._M_p._0_4_ = 2;
  local_60._M_dataplus._M_p._0_4_ = 9;
  local_94[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,(operand *)&local_60,local_94);
  local_88._M_dataplus._M_p = (pointer)((ulong)local_88._M_dataplus._M_p._4_4_ << 0x20);
  local_60._M_dataplus._M_p._0_4_ = 0xb;
  local_94[0] = NUMBER;
  local_94[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,(operand *)&local_60,local_94,(int *)(local_94 + 1));
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_88,psVar2,lab);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_60,psVar2,lab_00);
  local_94[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_94,&local_88);
  local_94[0] = XMM13|RBX;
  local_94[1] = 9;
  local_94[2] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_94,local_94 + 1,local_94 + 2);
  local_94[0] = BYTE_MEM_R15;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_94,&local_60);
  local_94[0] = ST6;
  local_94[1] = 0x1b;
  local_94[2] = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_94,local_94 + 1,local_94 + 2);
  local_94[0] = EMPTY;
  local_94[1] = 0xb;
  local_94[2] = 0x39;
  local_64 = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_94,local_94 + 1,local_94 + 2,&local_64);
  local_94[0] = RSI;
  local_94[1] = 9;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_94,local_94 + 1);
  local_94[0] = BYTE_MEM_R12;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_94,&local_88);
  local_94[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_94,&local_60);
  local_94[0] = ST6;
  local_94[1] = 9;
  local_94[2] = 0x39;
  local_64 = 0x4f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_94,local_94 + 1,local_94 + 2,&local_64);
  local_94[0] = BYTE_MEM_RDX;
  local_94[1] = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_94,local_94 + 1);
  if (ops->safe_primitives == true) {
    error_label(code,&local_40,re_vector_fill_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_),
                    local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_vector_fill(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNES, error);
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_vector(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, block_size_mask);
  code.add(asmcode::AND, asmcode::RAX, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));

  auto repeat = label_to_string(label++);
  auto done = label_to_string(label++);

  code.add(asmcode::LABEL, repeat);
  code.add(asmcode::TEST, asmcode::RAX, asmcode::RAX);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, asmcode::MEM_RCX, asmcode::RDX);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::RAX);
  code.add(asmcode::JMPS, repeat);
  code.add(asmcode::LABEL, done);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, skiwi_quiet_undefined);
  code.add(asmcode::JMP, CONTINUE);

  if (ops.safe_primitives)
    {
    error_label(code, error, re_vector_fill_contract_violation);
    }
  }